

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

void __thiscall
nvim::Nvim::async_buf_attach(Nvim *this,Buffer buffer,bool send_buffer,Dictionary *opts)

{
  bool local_59;
  string local_58;
  Buffer local_38;
  
  local_59 = send_buffer;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"nvim_buf_attach","");
  NvimRPC::
  async_call<long,bool,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            (&this->client_,&local_58,&local_38,&local_59,opts);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::async_buf_attach(Buffer buffer, bool send_buffer, const Dictionary& opts) {
    client_.async_call("nvim_buf_attach", buffer, send_buffer, opts);
}